

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlParseAttValue(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined *in_RAX;
  xmlChar *str;
  PyObject *pPVar2;
  undefined8 uVar3;
  PyObject *pyobj_ctxt;
  undefined *local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlParseAttValue");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlParseAttValue",&local_18);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_18 + 0x10);
      }
      str = (xmlChar *)xmlParseAttValue(uVar3);
      pPVar2 = libxml_xmlCharPtrWrap(str);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseAttValue(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlParserCtxtPtr ctxt;
    PyObject *pyobj_ctxt;

    if (libxml_deprecationWarning("xmlParseAttValue") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"O:xmlParseAttValue", &pyobj_ctxt))
        return(NULL);
    ctxt = (xmlParserCtxtPtr) PyparserCtxt_Get(pyobj_ctxt);

    c_retval = xmlParseAttValue(ctxt);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}